

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_15::LineCompositeTask::LineCompositeTask
          (LineCompositeTask *this,TaskGroup *group,Data *data,int y,int start,
          vector<const_char_*,_std::allocator<const_char_*>_> *names,
          vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
          *pointers,vector<unsigned_int,_std::allocator<unsigned_int>_> *total_sizes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *num_sources)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  TaskGroup *in_RSI;
  Task *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  
  IlmThread_2_5::Task::Task(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__LineCompositeTask_0350fe00;
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  *(undefined4 *)(in_RDI + 0x18) = in_ECX;
  *(undefined4 *)(in_RDI + 0x1c) = in_R8D;
  *(undefined8 *)(in_RDI + 0x20) = in_R9;
  *(undefined8 *)(in_RDI + 0x28) = in_stack_00000008;
  *(vector<const_char_*,_std::allocator<const_char_*>_> **)(in_RDI + 0x30) = names;
  *(ulong *)(in_RDI + 0x38) = CONCAT44(y,start);
  return;
}

Assistant:

LineCompositeTask ( TaskGroup* group ,
                        CompositeDeepScanLine::Data * data,
                    int y,
                    int start,
                    vector<const char*>* names,
                    vector<vector< vector<float *> > >* pointers,
                    vector<unsigned int>* total_sizes,
                    vector<unsigned int>* num_sources
                  ) : Task(group) ,
                     _Data(data),
                     _y(y),
                     _start(start),
                     _names(names),
                     _pointers(pointers),
                     _total_sizes(total_sizes),
                     _num_sources(num_sources)
                     {}